

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

void bcf_hdr_destroy(bcf_hdr_t *h)

{
  uint *__ptr;
  uint uVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  
  lVar6 = 0;
  do {
    __ptr = (uint *)h->dict[lVar6];
    if (__ptr != (uint *)0x0) {
      uVar1 = *__ptr;
      if (uVar1 != 0) {
        bVar3 = 0;
        uVar5 = 0;
        do {
          if ((*(uint *)(*(long *)(__ptr + 4) + (uVar5 >> 4) * 4) >> (bVar3 & 0x1e) & 3) == 0) {
            free(*(void **)(*(long *)(__ptr + 6) + uVar5 * 8));
            uVar1 = *__ptr;
          }
          uVar4 = (int)uVar5 + 1;
          uVar5 = (ulong)uVar4;
          bVar3 = bVar3 + 2;
        } while (uVar4 != uVar1);
      }
      free(*(void **)(__ptr + 6));
      free(*(void **)(__ptr + 4));
      free(*(void **)(__ptr + 8));
      free(__ptr);
      free(h->id[lVar6]);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  iVar2 = h->nhrec;
  if (0 < iVar2) {
    lVar6 = 0;
    do {
      bcf_hrec_destroy(h->hrec[lVar6]);
      lVar6 = lVar6 + 1;
      iVar2 = h->nhrec;
    } while (lVar6 < iVar2);
  }
  if (iVar2 != 0) {
    free(h->hrec);
  }
  if (h->samples != (char **)0x0) {
    free(h->samples);
  }
  free(h->keep_samples);
  free(h->transl[0]);
  free(h->transl[1]);
  free((h->mem).s);
  free(h);
  return;
}

Assistant:

void bcf_hdr_destroy(bcf_hdr_t *h)
{
    int i;
    khint_t k;
    for (i = 0; i < 3; ++i) {
        vdict_t *d = (vdict_t*)h->dict[i];
        if (d == 0) continue;
        for (k = kh_begin(d); k != kh_end(d); ++k)
            if (kh_exist(d, k)) free((char*)kh_key(d, k));
        kh_destroy(vdict, d);
        free(h->id[i]);
    }
    for (i=0; i<h->nhrec; i++)
        bcf_hrec_destroy(h->hrec[i]);
    if (h->nhrec) free(h->hrec);
    if (h->samples) free(h->samples);
    free(h->keep_samples);
    free(h->transl[0]); free(h->transl[1]);
    free(h->mem.s);
    free(h);
}